

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

idx_t __thiscall
duckdb::GroupedAggregateHashTable::AddChunk
          (GroupedAggregateHashTable *this,DataChunk *groups,Vector *group_hashes,DataChunk *payload
          ,unsafe_vector<idx_t> *filter)

{
  Vector *addresses_v;
  idx_t iVar1;
  TupleDataLayout *pTVar2;
  long right;
  
  if (groups->count != 0) {
    addresses_v = &(this->state).addresses;
    iVar1 = FindOrCreateGroupsInternal
                      (this,groups,group_hashes,addresses_v,&(this->state).new_groups);
    pTVar2 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                       (&(this->super_BaseAggregateHashTable).layout_ptr);
    right = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      (pTVar2->data_width + pTVar2->flag_width);
    VectorOperations::AddInPlace(addresses_v,right,payload->count);
    UpdateAggregates(this,payload,filter);
    return iVar1;
  }
  return 0;
}

Assistant:

idx_t GroupedAggregateHashTable::AddChunk(DataChunk &groups, Vector &group_hashes, DataChunk &payload,
                                          const unsafe_vector<idx_t> &filter) {
	if (groups.size() == 0) {
		return 0;
	}

#ifdef DEBUG
	D_ASSERT(groups.ColumnCount() + 1 == layout_ptr->ColumnCount());
	for (idx_t i = 0; i < groups.ColumnCount(); i++) {
		D_ASSERT(groups.GetTypes()[i] == layout_ptr->GetTypes()[i]);
	}
#endif

	const auto new_group_count = FindOrCreateGroups(groups, group_hashes, state.addresses, state.new_groups);
	VectorOperations::AddInPlace(state.addresses, NumericCast<int64_t>(layout_ptr->GetAggrOffset()), payload.size());

	UpdateAggregates(payload, filter);

	return new_group_count;
}